

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_New_Size(FT_Face face,FT_Size *asize)

{
  FT_Memory pFVar1;
  FT_Driver_Class pFVar2;
  size_t __n;
  FT_Size_InitFunc p_Var3;
  FT_ListNode pFVar4;
  FT_Size __s;
  FT_ListNode pFVar5;
  FT_Size_Internal pFVar6;
  FT_ListRec *pFVar7;
  int iVar8;
  
  if (face == (FT_Face)0x0) {
    iVar8 = 0x23;
  }
  else if (asize == (FT_Size *)0x0) {
    iVar8 = 6;
  }
  else if (face->driver == (FT_Driver)0x0) {
    iVar8 = 0x22;
  }
  else {
    *asize = (FT_Size)0x0;
    pFVar1 = face->memory;
    pFVar2 = face->driver->clazz;
    __n = pFVar2->size_object_size;
    if ((long)__n < 1) {
      __s = (FT_Size)0x0;
      iVar8 = 6;
      if (__n == 0) {
        iVar8 = 0;
      }
    }
    else {
      __s = (FT_Size)(*pFVar1->alloc)(pFVar1,__n);
      iVar8 = (uint)(__s == (FT_Size)0x0) << 6;
    }
    if ((0 < (long)__n) && (iVar8 == 0)) {
      memset(__s,0,__n);
    }
    if (iVar8 == 0) {
      pFVar5 = (FT_ListNode)(*pFVar1->alloc)(pFVar1,0x18);
      if (pFVar5 == (FT_ListNode)0x0) {
        iVar8 = (uint)(pFVar5 == (FT_ListNode)0x0) << 6;
      }
      else {
        pFVar5->prev = (FT_ListNode)0x0;
        pFVar5->next = (FT_ListNode)0x0;
        pFVar5->data = (void *)0x0;
        __s->face = face;
        pFVar6 = (FT_Size_Internal)(*pFVar1->alloc)(pFVar1,0x48);
        iVar8 = (uint)(pFVar6 == (FT_Size_Internal)0x0) << 6;
        if (pFVar6 != (FT_Size_Internal)0x0) {
          (pFVar6->autohint_metrics).descender = 0;
          (pFVar6->autohint_metrics).height = 0;
          (pFVar6->autohint_metrics).y_scale = 0;
          (pFVar6->autohint_metrics).ascender = 0;
          (pFVar6->autohint_metrics).x_ppem = 0;
          (pFVar6->autohint_metrics).y_ppem = 0;
          *(undefined4 *)&(pFVar6->autohint_metrics).field_0x4 = 0;
          (pFVar6->autohint_metrics).x_scale = 0;
          pFVar6->module_data = (void *)0x0;
          *(undefined8 *)&pFVar6->autohint_mode = 0;
          (pFVar6->autohint_metrics).max_advance = 0;
          __s->internal = pFVar6;
          p_Var3 = pFVar2->init_size;
          if (p_Var3 != (FT_Size_InitFunc)0x0) {
            iVar8 = (*p_Var3)(__s);
          }
          if (iVar8 == 0) {
            *asize = __s;
            pFVar5->data = __s;
            pFVar4 = (face->sizes_list).tail;
            pFVar5->next = (FT_ListNode)0x0;
            pFVar5->prev = pFVar4;
            pFVar7 = (FT_ListRec *)&pFVar4->next;
            if (pFVar4 == (FT_ListNode)0x0) {
              pFVar7 = &face->sizes_list;
            }
            pFVar7->head = pFVar5;
            (face->sizes_list).tail = pFVar5;
          }
        }
      }
    }
    else {
      pFVar5 = (FT_ListNode)0x0;
    }
    if (iVar8 != 0) {
      if (pFVar5 != (FT_ListNode)0x0) {
        (*pFVar1->free)(pFVar1,pFVar5);
      }
      if (__s != (FT_Size)0x0) {
        (*pFVar1->free)(pFVar1,__s);
      }
    }
  }
  return iVar8;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Size( FT_Face   face,
               FT_Size  *asize )
  {
    FT_Error         error;
    FT_Memory        memory;
    FT_Driver        driver;
    FT_Driver_Class  clazz;

    FT_Size          size = NULL;
    FT_ListNode      node = NULL;

    FT_Size_Internal  internal = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !asize )
      return FT_THROW( Invalid_Argument );

    if ( !face->driver )
      return FT_THROW( Invalid_Driver_Handle );

    *asize = NULL;

    driver = face->driver;
    clazz  = driver->clazz;
    memory = face->memory;

    /* Allocate new size object and perform basic initialisation */
    if ( FT_ALLOC( size, clazz->size_object_size ) || FT_NEW( node ) )
      goto Exit;

    size->face = face;

    if ( FT_NEW( internal ) )
      goto Exit;

    size->internal = internal;

    if ( clazz->init_size )
      error = clazz->init_size( size );

    /* in case of success, add to the face's list */
    if ( !error )
    {
      *asize     = size;
      node->data = size;
      FT_List_Add( &face->sizes_list, node );
    }

  Exit:
    if ( error )
    {
      FT_FREE( node );
      FT_FREE( size );
    }

    return error;
  }